

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PredicateSplitPassiveClauseContainers.cpp
# Opt level: O3

bool __thiscall
Saturation::PredicateSplitPassiveClauseContainer::exceedsWeightLimit
          (PredicateSplitPassiveClauseContainer *this,uint w,uint numPositiveLiterals,
          Inference *inference)

{
  pointer pfVar1;
  __uniq_ptr_impl<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>
  _Var2;
  char cVar3;
  ulong uVar4;
  long lVar5;
  pointer puVar6;
  uint uVar7;
  float extraout_XMM0_Da;
  
  (*(this->super_PassiveClauseContainer).super_RandomAccessClauseContainer.super_ClauseContainer.
    _vptr_ClauseContainer[0x15])(this,(ulong)numPositiveLiterals,inference);
  pfVar1 = (this->_cutoffs).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar5 = (long)(this->_cutoffs).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pfVar1;
  if (lVar5 == 0) {
    uVar4 = 0;
  }
  else {
    uVar4 = 0;
    do {
      if (extraout_XMM0_Da <= pfVar1[uVar4]) break;
      uVar4 = (ulong)((int)uVar4 + 1);
    } while (uVar4 < (ulong)(lVar5 >> 2));
  }
  puVar6 = (this->_queues).
           super__Vector_base<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  cVar3 = '\x01';
  if (uVar4 < (ulong)((long)(this->_queues).
                            super__Vector_base<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)puVar6 >> 3)) {
    uVar7 = (uint)uVar4;
    do {
      uVar7 = uVar7 + 1;
      _Var2._M_t.
      super__Tuple_impl<0UL,_Saturation::PassiveClauseContainer_*,_std::default_delete<Saturation::PassiveClauseContainer>_>
      .super__Head_base<0UL,_Saturation::PassiveClauseContainer_*,_false>._M_head_impl =
           puVar6[uVar4]._M_t.
           super___uniq_ptr_impl<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>
           ._M_t;
      cVar3 = (**(code **)(*(long *)_Var2._M_t.
                                    super__Tuple_impl<0UL,_Saturation::PassiveClauseContainer_*,_std::default_delete<Saturation::PassiveClauseContainer>_>
                                    .
                                    super__Head_base<0UL,_Saturation::PassiveClauseContainer_*,_false>
                                    ._M_head_impl + 0x88))
                        (_Var2._M_t.
                         super__Tuple_impl<0UL,_Saturation::PassiveClauseContainer_*,_std::default_delete<Saturation::PassiveClauseContainer>_>
                         .super__Head_base<0UL,_Saturation::PassiveClauseContainer_*,_false>.
                         _M_head_impl,w,numPositiveLiterals,inference);
      if (cVar3 == '\0') {
        return (bool)'\0';
      }
      uVar4 = (ulong)uVar7;
      puVar6 = (this->_queues).
               super__Vector_base<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar4 < (ulong)((long)(this->_queues).
                                   super__Vector_base<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)puVar6 >> 3));
  }
  return (bool)cVar3;
}

Assistant:

bool PredicateSplitPassiveClauseContainer::exceedsWeightLimit(unsigned w, unsigned numPositiveLiterals, const Inference& inference) const
{
  auto bestQueueIndex = bestQueue(evaluateFeatureEstimate(numPositiveLiterals, inference));
  // note: even for non-layered-arrangements, we need to go through all queues, since the values for age, w, ... are only lower bounds (in the sense that the actual value could lead to a worse bestQueueIndex)
  for (unsigned i = bestQueueIndex; i < _queues.size(); i++)
  {
    auto& queue = _queues[i];
    if (!queue->exceedsWeightLimit(w, numPositiveLiterals, inference))
    {
      return false;
    }
  }
  return true;
}